

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

int __thiscall
ncnn::Mat::clone(Mat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  size_t sVar2;
  Mat *m;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffa8;
  int iVar3;
  void *__dest;
  size_t in_stack_ffffffffffffffb0;
  void *__src;
  int _w;
  Mat *this_00;
  Allocator *in_stack_ffffffffffffffd0;
  
  this_00 = this;
  bVar1 = empty((Mat *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    Mat(this);
    iVar3 = (int)this_00;
  }
  else {
    Mat(this);
    iVar3 = (int)(in_stack_ffffffffffffffa8 >> 0x20);
    _w = (int)((ulong)this >> 0x20);
    if (*(int *)(__fn + 0x28) == 1) {
      create(this_00,_w,in_stack_ffffffffffffffb0,iVar3,
             (Allocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      iVar3 = (int)this_00;
    }
    else if (*(int *)(__fn + 0x28) == 2) {
      create(this_00,_w,(int)this,in_stack_ffffffffffffffb0,iVar3,
             (Allocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      iVar3 = (int)this_00;
    }
    else {
      if (*(int *)(__fn + 0x28) == 3) {
        create(this_00,_w,(int)this,(int)(in_stack_ffffffffffffffb0 >> 0x20),
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0);
      }
      iVar3 = (int)this_00;
    }
    sVar2 = total((Mat *)__fn);
    if (sVar2 != 0) {
      __dest = this->data;
      __src = *(void **)__fn;
      sVar2 = total((Mat *)__fn);
      memcpy(__dest,__src,sVar2 * *(long *)(__fn + 0x10));
    }
  }
  return iVar3;
}

Assistant:

inline Mat Mat::clone(Allocator* allocator) const
{
    if (empty())
        return Mat();

    Mat m;
    if (dims == 1)
        m.create(w, elemsize, elempack, allocator);
    else if (dims == 2)
        m.create(w, h, elemsize, elempack, allocator);
    else if (dims == 3)
        m.create(w, h, c, elemsize, elempack, allocator);

    if (total() > 0)
    {
        memcpy(m.data, data, total() * elemsize);
    }

    return m;
}